

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool anon_unknown.dwarf_12ec9::copy_data(archive *ar,archive *aw)

{
  bool bVar1;
  int iVar2;
  la_ssize_t r_00;
  la_ssize_t w;
  la_int64_t offset;
  size_t size;
  void *buff;
  long r;
  archive *aw_local;
  archive *ar_local;
  
  r = (long)aw;
  aw_local = ar;
  while( true ) {
    iVar2 = archive_read_data_block(aw_local,(void **)&size,(size_t *)&offset,&w);
    buff = (void *)(long)iVar2;
    if (buff == (void *)0x1) {
      return true;
    }
    bVar1 = la_diagnostic(aw_local,(la_ssize_t)buff);
    if (!bVar1) break;
    r_00 = archive_write_data_block((archive *)r,(void *)size,offset,w);
    bVar1 = la_diagnostic(aw_local,r_00);
    if (!bVar1) {
      return false;
    }
  }
  return false;
}

Assistant:

bool copy_data(struct archive* ar, struct archive* aw)
{
  long r;
  const void* buff;
  size_t size;
#  if defined(ARCHIVE_VERSION_NUMBER) && ARCHIVE_VERSION_NUMBER >= 3000000
  __LA_INT64_T offset;
#  else
  off_t offset;
#  endif

  for (;;) {
    // See archive.h definition of ARCHIVE_OK for return values.
    r = archive_read_data_block(ar, &buff, &size, &offset);
    if (r == ARCHIVE_EOF) {
      return true;
    }
    if (!la_diagnostic(ar, r)) {
      return false;
    }
    // See archive.h definition of ARCHIVE_OK for return values.
    __LA_SSIZE_T const w = archive_write_data_block(aw, buff, size, offset);
    if (!la_diagnostic(ar, w)) {
      return false;
    }
  }
#  if !defined(__clang__) && !defined(__NVCOMPILER) && !defined(__HP_aCC)
  return false; /* this should not happen but it quiets some compilers */
#  endif
}